

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O1

int do_or(void)

{
  byte bVar1;
  byte bVar2;
  vm_register *pvVar3;
  undefined4 *puVar4;
  ushort uVar5;
  byte bVar6;
  uint uVar7;
  uint *puVar8;
  byte bVar9;
  bool bVar10;
  
  pvVar3 = registe_ptr;
  uVar7 = registe_ptr->IP;
  bVar6 = code_ptr[uVar7 + 2];
  bVar1 = bVar6 >> 4;
  bVar9 = bVar6 & 0xf;
  if (code_ptr[uVar7 + 1] == '\x01') {
    if (bVar9 != 2) {
      if (bVar9 != 1) {
        if ((bVar6 & 0xf) != 0) goto LAB_0010441f;
        bVar6 = (byte)*register_list[bVar1] | code_ptr[(ulong)uVar7 + 3];
        *(byte *)register_list[bVar1] = bVar6;
        pvVar3 = registe_ptr;
        if (bVar6 != 0) {
          bVar10 = (char)bVar6 < '\0';
          if ((char)bVar6 < '\x01') goto LAB_00104373;
          goto LAB_001043c3;
        }
        goto LAB_0010440e;
      }
      puVar8 = register_list[bVar1];
      uVar5 = (ushort)*puVar8 | *(ushort *)(code_ptr + (ulong)uVar7 + 3);
LAB_001043b9:
      *(ushort *)puVar8 = uVar5;
      if (uVar5 != 0) {
        bVar10 = (short)uVar5 < 0;
        if (0 < (short)uVar5) {
LAB_001043c3:
          pvVar3->flag[0] = '\x01';
          pvVar3->flag[1] = '\x01';
          return 1;
        }
LAB_00104373:
        if (!bVar10) {
          return 1;
        }
        pvVar3->flag[0] = '\x01';
        pvVar3->flag[1] = '\0';
        return 1;
      }
      goto LAB_0010440e;
    }
    uVar7 = *register_list[bVar1] | *(uint *)(code_ptr + (ulong)uVar7 + 3);
    *register_list[bVar1] = uVar7;
  }
  else {
    if (code_ptr[uVar7 + 1] != '\0') {
LAB_0010441f:
      puVar4 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar4 = 0xf6;
      __cxa_throw(puVar4,&int::typeinfo,0);
    }
    bVar2 = (byte)code_ptr[uVar7 + 3] >> 4;
    if (bVar9 != 2) {
      if (bVar9 != 1) {
        if ((bVar6 & 0xf) != 0) goto LAB_0010441f;
        bVar6 = (byte)*register_list[bVar1] | (byte)*register_list[bVar2];
        *(byte *)register_list[bVar1] = bVar6;
        pvVar3 = registe_ptr;
        if (bVar6 == 0) goto LAB_0010440e;
        bVar10 = (char)bVar6 < '\0';
        if ('\0' < (char)bVar6) goto LAB_001043c3;
        goto LAB_00104373;
      }
      puVar8 = register_list[bVar1];
      uVar5 = (ushort)*puVar8 | (ushort)*register_list[bVar2];
      goto LAB_001043b9;
    }
    uVar7 = *register_list[bVar1] | *register_list[bVar2];
    *register_list[bVar1] = uVar7;
  }
  if (uVar7 != 0) {
    pvVar3->flag[0] = '\x01';
    if (0 < (int)uVar7) {
      pvVar3->flag[1] = '\x01';
      return 1;
    }
    pvVar3->flag[1] = '\0';
    return 1;
  }
LAB_0010440e:
  pvVar3->flag[0] = '\0';
  return 1;
}

Assistant:

int do_or() {
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
	uint8_t low = (uint8_t)code_ptr[registe_ptr->IP + 2] % 0x10;
	if (code_ptr[registe_ptr->IP + 1] == 0)//0型命令
	{
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		if (low == 0) {
			char*Ra = (char *)register_list[high];
			char*Rb = (char*)register_list[highb];
			*Ra |= *Rb;
			set_flag(*Ra);
		}
		else if (low == 1)
		{
			int16_t*Ra = (int16_t *)register_list[high];
			int16_t*Rb = (int16_t *)register_list[highb];
			*Ra |= *Rb;
			set_flag(*Ra);
		}
		else if (low == 2)
		{
			unsigned*Ra = (unsigned *)register_list[high];
			unsigned*Rb = (unsigned*)register_list[highb];
			*Ra |= *Rb;
			set_flag(*Ra);
		}
		else throw(LVM_EXECUTE_ERROR);
	}
	else if (code_ptr[registe_ptr->IP + 1] == 1) {//1型命令
		if (low == 0)//低位运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			char *R = (char *)register_list[high];
			*R |= temp;
			set_flag(*R);
		}
		else if (low == 1)//高位运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			int16_t *R = (int16_t *)register_list[high];
			*R |= temp;
			set_flag(*R);
		}
		else if (low == 2)//全运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			unsigned *R = (unsigned *)register_list[high];
			*R |= temp;
			set_flag(*R);
		}
		else throw(LVM_EXECUTE_ERROR);

	}
	else throw(LVM_EXECUTE_ERROR);
	return LVM_SUCCESS;
}